

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O3

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::splitExtBorders
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,IntervalT *I)

{
  _Rb_tree_header *hint;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  _Var3;
  _Base_ptr p_Var4;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  hint_00;
  Offset OVar5;
  bool bVar6;
  bool bVar7;
  
  p_Var2 = (this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  hint = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header;
  hint_00._M_node = &hint->_M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      bVar6 = *(ulong *)(p_Var2 + 1) < (I->start).offset;
      if (!bVar6) {
        hint_00._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar6];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)hint_00._M_node != hint) {
      OVar5.offset = (I->end).offset;
      _Var3._M_node = hint_00._M_node;
      do {
        if (OVar5.offset < *(ulong *)(_Var3._M_node + 1)) break;
        if (OVar5.offset < _Var3._M_node[1]._M_parent) {
          DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
          splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                    ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)this,_Var3,OVar5,
                     (_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                      )hint);
          p_Var4 = (this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          bVar6 = true;
          hint_00._M_node = &hint->_M_header;
          if (p_Var4 != (_Base_ptr)0x0) {
            do {
              bVar7 = *(ulong *)(p_Var4 + 1) < (I->start).offset;
              if (!bVar7) {
                hint_00._M_node = p_Var4;
              }
              p_Var4 = (&p_Var4->_M_left)[bVar7];
            } while (p_Var4 != (_Base_ptr)0x0);
          }
          goto LAB_00115298;
        }
        _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
      } while ((_Rb_tree_header *)_Var3._M_node != hint);
      bVar6 = false;
LAB_00115298:
      if (hint_00._M_node == (this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
      {
        return bVar6;
      }
      _Var3._M_node = (_Base_ptr)std::_Rb_tree_decrement(hint_00._M_node);
      p_Var4 = _Var3._M_node[1]._M_parent;
      p_Var1 = (_Base_ptr)(I->start).offset;
      if (p_Var1 <= p_Var4) {
        OVar5.offset = (type)p_Var1;
        if (p_Var1 != Offset::UNKNOWN) {
          OVar5.offset = (type)((long)&p_Var1[-1]._M_right + 7);
          if (Offset::UNKNOWN == (_Base_ptr)0x1) {
            OVar5.offset = (type)Offset::UNKNOWN;
          }
          if (p_Var1 == (_Base_ptr)0x0) {
            OVar5.offset = (type)Offset::UNKNOWN;
          }
        }
        hint_00 = DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
                  splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                            ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)this,_Var3,OVar5
                             ,hint_00);
        bVar6 = true;
      }
      OVar5.offset = (I->end).offset;
      if (p_Var4 <= OVar5.offset) {
        return bVar6;
      }
      _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(hint_00._M_node);
      hint_00._M_node = &hint->_M_header;
      goto LAB_00115309;
    }
  }
  _Var3._M_node = (_Base_ptr)std::_Rb_tree_decrement(&hint->_M_header);
  p_Var4 = _Var3._M_node[1]._M_parent;
  OVar5.offset = (I->end).offset;
  bVar6 = OVar5.offset < p_Var4;
  if (OVar5.offset < p_Var4) {
    _Var3 = DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
            splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                      ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)this,_Var3,OVar5,
                       hint_00);
    p_Var4 = _Var3._M_node[1]._M_parent;
  }
  p_Var1 = (_Base_ptr)(I->start).offset;
  if (p_Var4 < p_Var1) {
    return bVar6;
  }
  OVar5.offset = (type)p_Var1;
  if (p_Var1 != Offset::UNKNOWN) {
    OVar5.offset = (type)((long)&p_Var1[-1]._M_right + 7);
    if (Offset::UNKNOWN == (_Base_ptr)0x1) {
      OVar5.offset = (type)Offset::UNKNOWN;
    }
    if (p_Var1 == (_Base_ptr)0x0) {
      OVar5.offset = (type)Offset::UNKNOWN;
    }
  }
LAB_00115309:
  DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
  splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
            ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)this,_Var3,OVar5,hint_00);
  return true;
}

Assistant:

bool splitExtBorders(const IntervalT &I) {
        assert(!_mapping.empty());
        bool changed = false;

        auto ge = _mapping.lower_bound(I);
        if (ge == _mapping.end()) {
            // the last interval must start somewhere to the
            // left from our new interval
            auto last = _get_last();
            assert(last->first.start < I.start);

            if (last->first.end > I.end) {
                last = splitIntervalHint(last, I.end, ge);
                changed |= true;
            }

            if (last->first.end >= I.start) {
                splitIntervalHint(last, I.start - 1, ge);
                changed |= true;
            }
            return changed;
        }

        // we found an interval starting at I.start
        // or later
        assert(ge->first.start >= I.start);
        // FIXME: optimize this...
        //  add _find_le to find the "closest" interval from the right
        //  (maybe iterating like this is faster, though)
        auto it = ge;
        while (it->first.start <= I.end) {
            if (it->first.end > I.end) {
                it = splitIntervalHint(it, I.end, _mapping.end());
                changed = true;
                break;
            }
            ++it;
            if (it == _mapping.end())
                break;
        }

        // we may have also overlap from the previous interval
        if (changed)
            ge = _mapping.lower_bound(I);
        if (ge != _mapping.begin()) {
            auto prev = ge;
            --prev;
            auto prev_end = prev->first.end;
            if (prev_end >= I.start) {
                ge = splitIntervalHint(prev, I.start - 1, ge);
                changed = true;
            }
            // is the new interval entirely covered by the previous?
            if (prev_end > I.end) {
                // get the higher of the new intervals
                ++ge;
                assert(ge != _mapping.end());
                assert(ge->first.end == prev_end);
#ifndef NDEBUG
                auto check =
#endif
                        splitIntervalHint(ge, I.end, _mapping.end());
                assert(check->first == I);
                changed = true;
            }
        }

        return changed;
    }